

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
* __thiscall
Catch::
createShard<std::set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>>
          (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
           *__return_storage_ptr__,Catch *this,
          set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
          *container,size_t shardCount,size_t shardIndex)

{
  ulong uVar1;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> __first;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> __last;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (shardCount < container) {
    if (container ==
        (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
         *)0x1) {
      std::
      _Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
      ::_Rb_tree(&__return_storage_ptr__->_M_t,
                 (_Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                  *)this);
    }
    else {
      uVar1 = *(ulong *)(this + 0x28) / (ulong)container;
      uVar2 = *(ulong *)(this + 0x28) % (ulong)container;
      sVar3 = shardCount;
      if (uVar2 < shardCount) {
        sVar3 = uVar2;
      }
      uVar4 = shardCount + 1;
      uVar5 = uVar4;
      if (uVar2 < uVar4) {
        uVar5 = uVar2;
      }
      __first = std::next<std::_Rb_tree_const_iterator<Catch::TestCaseHandle_const*>>
                          (*(_Base_ptr *)(this + 0x18),sVar3 + uVar1 * shardCount);
      __last = std::next<std::_Rb_tree_const_iterator<Catch::TestCaseHandle_const*>>
                         (*(_Base_ptr *)(this + 0x18),uVar5 + uVar1 * uVar4);
      std::
      set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
      ::set<std::_Rb_tree_const_iterator<Catch::TestCaseHandle_const*>>
                ((set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                  *)__return_storage_ptr__,__first,__last);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("shardCount > shardIndex",
                "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                ,0x26ba,
                "Container Catch::createShard(const Container &, const std::size_t, const std::size_t) [Container = std::set<const Catch::TestCaseHandle *>]"
               );
}

Assistant:

Container createShard(Container const& container, std::size_t const shardCount, std::size_t const shardIndex) {
        assert(shardCount > shardIndex);

        if (shardCount == 1) {
            return container;
        }

        const std::size_t totalTestCount = container.size();

        const std::size_t shardSize = totalTestCount / shardCount;
        const std::size_t leftoverTests = totalTestCount % shardCount;

        const std::size_t startIndex = shardIndex * shardSize + (std::min)(shardIndex, leftoverTests);
        const std::size_t endIndex = (shardIndex + 1) * shardSize + (std::min)(shardIndex + 1, leftoverTests);

        auto startIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(startIndex));
        auto endIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(endIndex));

        return Container(startIterator, endIterator);
    }